

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

CTypeID argv2ctype(jit_State *J,TRef tr,cTValue *o)

{
  IRRef1 IVar1;
  TRef TVar2;
  int iVar3;
  ulong uVar4;
  GCcdata *pGVar5;
  uint in_ESI;
  jit_State *in_RDI;
  GCcdata *cd;
  CTypeID oldtop;
  CPState cp;
  GCstr *s;
  CTState *cts;
  CPState *in_stack_000000f0;
  TraceError in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  TRef in_stack_ffffffffffffff24;
  GCcdata *in_stack_ffffffffffffff28;
  jit_State *J_00;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined2 in_stack_ffffffffffffff36;
  GCobj *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint uVar6;
  CTypeID local_ac;
  CTypeID local_24;
  
  if ((in_ESI & 0x1f000000) == 0x4000000) {
    IVar1 = (IRRef1)in_ESI;
    J_00 = in_RDI;
    TVar2 = lj_ir_kgc((jit_State *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      in_stack_ffffffffffffff38,CONCAT22(IVar1,in_stack_ffffffffffffff34));
    (J_00->fold).ins.field_0.ot = 0x884;
    (J_00->fold).ins.field_0.op1 = IVar1;
    (J_00->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold(J_00);
    uVar4 = (ulong)*(uint *)((ulong)(in_RDI->L->glref).ptr32 + 0x194);
    *(lua_State **)(uVar4 + 0x10) = in_RDI->L;
    uVar6 = *(uint *)(uVar4 + 8);
    iVar3 = lj_cparse(in_stack_000000f0);
    if ((iVar3 != 0) || (uVar6 < *(uint *)(uVar4 + 8))) {
      lj_trace_err((jit_State *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c);
    }
    local_24 = local_ac;
  }
  else {
    pGVar5 = argv2cdata((jit_State *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (TRef)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                        (cTValue *)
                        CONCAT26(in_stack_ffffffffffffff36,
                                 CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)));
    if (pGVar5->ctypeid == 0x15) {
      local_24 = crec_constructor((jit_State *)
                                  CONCAT26(in_stack_ffffffffffffff36,
                                           CONCAT24(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30)),
                                  in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    }
    else {
      local_24 = (CTypeID)pGVar5->ctypeid;
    }
  }
  return local_24;
}

Assistant:

static CTypeID argv2ctype(jit_State *J, TRef tr, cTValue *o)
{
  if (tref_isstr(tr)) {
    GCstr *s = strV(o);
    CPState cp;
    CTypeID oldtop;
    /* Specialize to the string containing the C type declaration. */
    emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, s));
    cp.L = J->L;
    cp.cts = ctype_cts(J->L);
    oldtop = cp.cts->top;
    cp.srcname = strdata(s);
    cp.p = strdata(s);
    cp.param = NULL;
    cp.mode = CPARSE_MODE_ABSTRACT|CPARSE_MODE_NOIMPLICIT;
    if (lj_cparse(&cp) || cp.cts->top > oldtop)  /* Avoid new struct defs. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    return cp.val.id;
  } else {
    GCcdata *cd = argv2cdata(J, tr, o);
    return cd->ctypeid == CTID_CTYPEID ? crec_constructor(J, cd, tr) :
					cd->ctypeid;
  }
}